

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_test.c
# Opt level: O0

void test_cv_producer_consumer0(testing t)

{
  cv_queue *a1;
  closure *cl;
  cv_queue *q;
  testing t_local;
  
  a1 = cv_queue_new(1);
  cl = closure_producer_cv_n(producer_cv_n,t,a1,0,100000);
  closure_fork(cl);
  consumer_cv_n(t,a1,0,100000);
  free(a1);
  return;
}

Assistant:

static void test_cv_producer_consumer0 (testing t) {
	cv_queue *q = cv_queue_new (1);
	closure_fork (closure_producer_cv_n (&producer_cv_n, t, q, 0, CV_PRODUCER_CONSUMER_N));
	consumer_cv_n (t, q, 0, CV_PRODUCER_CONSUMER_N);
	free (q);
}